

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Performance::anon_unknown_0::RelativeChangeCase::calibrate(RelativeChangeCase *this)

{
  code *pcVar1;
  int iVar2;
  State SVar3;
  undefined4 uVar4;
  undefined4 extraout_var;
  TestLog *log_00;
  deUint64 dVar6;
  deUint64 dVar7;
  deInt64 now;
  deInt64 prev;
  GLuint program;
  deUint8 buffer [4];
  undefined1 local_288 [8];
  TheilSenCalibrator calibrator;
  ObjectData local_218;
  undefined1 local_130 [8];
  RenderData geom;
  TestLog *log;
  Functions *gl;
  RelativeChangeCase *this_local;
  long lVar5;
  
  iVar2 = (*((this->super_BaseCase).m_renderCtx)->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  geom._256_8_ = tcu::TestContext::getLog
                           ((this->super_BaseCase).super_TestCase.super_TestNode.m_testCtx);
  (*(this->super_BaseCase).super_TestCase.super_TestNode._vptr_TestNode[8])();
  RenderData::RenderData
            ((RenderData *)local_130,&local_218,(this->super_BaseCase).m_renderCtx,
             (TestLog *)geom._256_8_);
  ObjectData::~ObjectData(&local_218);
  deqp::gls::CalibratorParameters::CalibratorParameters
            ((CalibratorParameters *)buffer,0x14,10,20.0,0x14,33.0,40.0,1000.0);
  deqp::gls::TheilSenCalibrator::TheilSenCalibrator
            ((TheilSenCalibrator *)local_288,(CalibratorParameters *)buffer);
  while( true ) {
    while (SVar3 = deqp::gls::TheilSenCalibrator::getState((TheilSenCalibrator *)local_288),
          SVar3 == STATE_RECOMPUTE_PARAMS) {
      deqp::gls::TheilSenCalibrator::recomputeParameters((TheilSenCalibrator *)local_288);
    }
    if (SVar3 != STATE_MEASURE) break;
    prev._0_4_ = glu::ShaderProgram::getProgram((ShaderProgram *)local_130);
    (**(code **)(lVar5 + 0x1680))((deUint32)prev);
    pcVar1 = *(code **)(lVar5 + 0x14f0);
    uVar4 = (**(code **)(lVar5 + 0xb48))((deUint32)prev,"u_iterations");
    iVar2 = deqp::gls::TheilSenCalibrator::getCallCount((TheilSenCalibrator *)local_288);
    (*pcVar1)(uVar4,iVar2);
    dVar6 = deGetMicroseconds();
    (**(code **)(lVar5 + 0x188))(0x4500);
    (**(code **)(lVar5 + 0x4e8))(0xb71);
    BaseCase::render(&this->super_BaseCase,(RenderData *)local_130);
    (**(code **)(lVar5 + 0x1220))(0,0,1,1,0x1908,0x1401,(long)&prev + 4);
    dVar7 = deGetMicroseconds();
    deqp::gls::TheilSenCalibrator::recordIteration((TheilSenCalibrator *)local_288,dVar7 - dVar6);
  }
  if (SVar3 == STATE_FINISHED) {
    log_00 = tcu::TestContext::getLog
                       ((this->super_BaseCase).super_TestCase.super_TestNode.m_testCtx);
    deqp::gls::logCalibrationInfo(log_00,(TheilSenCalibrator *)local_288);
    this_local._4_4_ = deqp::gls::TheilSenCalibrator::getCallCount((TheilSenCalibrator *)local_288);
  }
  else {
    this_local._4_4_ = 1;
  }
  program = 1;
  deqp::gls::TheilSenCalibrator::~TheilSenCalibrator((TheilSenCalibrator *)local_288);
  RenderData::~RenderData((RenderData *)local_130);
  return this_local._4_4_;
}

Assistant:

int RelativeChangeCase::calibrate (void) const
{
	using namespace gls;

	const glw::Functions&	gl		= m_renderCtx.getFunctions();
	TestLog&				log		= m_testCtx.getLog();

	const RenderData		geom	(genOccludedGeometry(), m_renderCtx, log);

	TheilSenCalibrator calibrator(CalibratorParameters( 20, // Initial workload
														10, // Max iteration frames
														20.0f, // Iteration shortcut threshold ms
														20, // Max iterations
														33.0f, // Target frame time
														40.0f, // Frame time cap
														1000.0f // Target measurement duration
														));

	while (true)
	{
		switch(calibrator.getState())
		{
			case TheilSenCalibrator::STATE_FINISHED:
				logCalibrationInfo(m_testCtx.getLog(), calibrator);
				return calibrator.getCallCount();

			case TheilSenCalibrator::STATE_MEASURE:
			{
				deUint8			buffer[4];
				const GLuint	program	= geom.m_program.getProgram();

				gl.useProgram(program);
				gl.uniform1i(gl.getUniformLocation(program, "u_iterations"), calibrator.getCallCount());

				const deInt64 prev = deGetMicroseconds();

				gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
				gl.disable(GL_DEPTH_TEST);

				render(geom);

				gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, buffer);

				const deInt64 now = deGetMicroseconds();

				calibrator.recordIteration(now - prev);
				break;
			}

			case TheilSenCalibrator::STATE_RECOMPUTE_PARAMS:
				calibrator.recomputeParameters();
				break;
			default:
				DE_ASSERT(false);
				return 1;
		}
	}
}